

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong uVar1;
  TestError *this_00;
  allocator<char> local_1fe;
  allocator<char> local_1fd;
  TestShaderType local_1fc;
  string iteration_specific_shader_code_part;
  string shader_code_common_part;
  string y_variable_initializaton;
  string shader_source;
  string x_variable_initializaton;
  string local_150 [32];
  string local_130 [32];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90 [32];
  string variable_initialiser;
  string local_50 [32];
  
  local_1fc = tested_shader_type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&variable_initialiser,
             "    float[](float[](float(float(float(float(float(float(1.0))))))));\n",
             (allocator<char> *)&x_variable_initializaton);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"float",(allocator<char> *)&iteration_specific_shader_code_part);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"1.0",(allocator<char> *)&shader_source);
  recursively_initialise(&shader_code_common_part,this,&local_b0,8,&local_d0);
  std::operator+(&y_variable_initializaton,"    float x[2][2][2][2][2][2][2][1] = ",
                 &shader_code_common_part);
  std::operator+(&x_variable_initializaton,&y_variable_initializaton,";\n");
  std::__cxx11::string::~string((string *)&y_variable_initializaton);
  std::__cxx11::string::~string((string *)&shader_code_common_part);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"float",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"1.0",&local_1fe);
  recursively_initialise(&iteration_specific_shader_code_part,this,&local_f0,8,&local_110);
  std::operator+(&shader_code_common_part,"    float y[2][2][2][2][2][2][2][1] = ",
                 &iteration_specific_shader_code_part);
  std::operator+(&y_variable_initializaton,&shader_code_common_part,";\n");
  std::__cxx11::string::~string((string *)&shader_code_common_part);
  std::__cxx11::string::~string((string *)&iteration_specific_shader_code_part);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::operator+(&iteration_specific_shader_code_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,&x_variable_initializaton);
  std::operator+(&shader_code_common_part,&iteration_specific_shader_code_part,
                 &y_variable_initializaton);
  std::__cxx11::string::~string((string *)&iteration_specific_shader_code_part);
  uVar1 = (ulong)local_1fc;
  iteration_specific_shader_code_part._M_dataplus._M_p =
       (pointer)&iteration_specific_shader_code_part.field_2;
  iteration_specific_shader_code_part._M_string_length = 0;
  iteration_specific_shader_code_part.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>(local_130,"    x",&local_1fe);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"[0]",&local_1fd);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_130,local_50,1);
  std::__cxx11::string::append((string *)&iteration_specific_shader_code_part);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::append((char *)&iteration_specific_shader_code_part);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"y",&local_1fe);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"[0]",&local_1fd);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(&shader_source,this,local_150,local_90,1);
  std::__cxx11::string::append((string *)&iteration_specific_shader_code_part);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::append((char *)&iteration_specific_shader_code_part);
  std::operator+(&shader_source,&shader_code_common_part,&iteration_specific_shader_code_part);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_1fc) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xcd6);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b900e7::switchdataD_0171c4c4 +
         (long)(int)(&switchD_00b900e7::switchdataD_0171c4c4)[uVar1]) {
  case 0xb900e9:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb900fa:
  case 0xb90101:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_0171c4dc + *(int *)(&DAT_0171c4dc + uVar1 * 4)))
            (&DAT_0171c4dc + *(int *)(&DAT_0171c4dc + uVar1 * 4),empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_);
  return;
}

Assistant:

void ExpressionsIndexingArray2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string variable_initialiser = "    float[](float[](float(float(float(float(float(float(1.0))))))));\n";

	std::string x_variable_initializaton =
		"    float x[2][2][2][2][2][2][2][1] = " + recursively_initialise("float", API::MAX_ARRAY_DIMENSIONS, "1.0") +
		";\n";
	std::string y_variable_initializaton =
		"    float y[2][2][2][2][2][2][2][1] = " + recursively_initialise("float", API::MAX_ARRAY_DIMENSIONS, "1.0") +
		";\n";

	std::string shader_code_common_part = shader_start + x_variable_initializaton + y_variable_initializaton;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string iteration_specific_shader_code_part;

		iteration_specific_shader_code_part += this->extend_string("    x", "[0]", max_dimension_index);
		iteration_specific_shader_code_part += " = ";
		iteration_specific_shader_code_part += this->extend_string("y", "[0]", max_dimension_index);
		iteration_specific_shader_code_part += ";\n";

		std::string shader_source = shader_code_common_part + iteration_specific_shader_code_part;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	}
}